

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O0

weak_ptr<rest_rpc::rpc_service::connection> *
rest_rpc::rpc_service::router::
call_helper<std::__cxx11::string(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,person_const&),0ul,person>
          (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_weak_ptr<rest_rpc::rpc_service::connection>_person_ptr
           **f,index_sequence<0UL> *param_2,tuple<person> *tup,
          weak_ptr<rest_rpc::rpc_service::connection> *ptr)

{
  code *pcVar1;
  __tuple_element_t<0UL,_tuple<person>_> *p_Var2;
  undefined8 *in_RSI;
  weak_ptr<rest_rpc::rpc_service::connection> *in_RDI;
  weak_ptr<rest_rpc::rpc_service::connection> *in_R8;
  weak_ptr<rest_rpc::rpc_service::connection> *pwVar3;
  undefined1 local_38 [56];
  
  pcVar1 = (code *)*in_RSI;
  pwVar3 = in_RDI;
  std::weak_ptr<rest_rpc::rpc_service::connection>::weak_ptr(in_RDI,in_R8);
  p_Var2 = std::get<0ul,person>((tuple<person> *)0x208e70);
  (*pcVar1)(in_RDI,local_38,p_Var2);
  std::weak_ptr<rest_rpc::rpc_service::connection>::~weak_ptr
            ((weak_ptr<rest_rpc::rpc_service::connection> *)0x208e90);
  return pwVar3;
}

Assistant:

static typename std::result_of<F(std::weak_ptr<connection>, Args...)>::type
  call_helper(const F &f, const nonstd::index_sequence<I...> &,
              std::tuple<Args...> tup, std::weak_ptr<connection> ptr) {
    return f(ptr, std::move(std::get<I>(tup))...);
  }